

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square.hpp
# Opt level: O0

vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
* ising::dos::square::finite<512u,100u,int>(uint_t m,uint_t n)

{
  byte bVar1;
  undefined4 *puVar2;
  ulong in_RDX;
  ulong in_RSI;
  __normal_iterator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_*,_std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>_>
  in_RDI;
  number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
  sum;
  uint i;
  promote<fvar<number<cpp_dec_float<100U>_>,_512UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_512UL>_>
  zmn;
  uint j;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
  v;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
  ak;
  uint k;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
  z4;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
  z3;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
  z2;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
  z1;
  promote<fvar<number<cpp_dec_float<100U>_>,_512UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_512UL>_>
  sn;
  promote<fvar<number<cpp_dec_float<100U>_>,_512UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_512UL>_>
  cn;
  promote<fvar<number<cpp_dec_float<100U>_>,_512UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_512UL>_>
  s0;
  promote<fvar<number<cpp_dec_float<100U>_>,_512UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_512UL>_>
  c0;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
  beta_m;
  promote<fvar<number<cpp_dec_float<100U>_>,_512UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_512UL>_>
  beta;
  autodiff_fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>,_512UL>
  xmo;
  autodiff_fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>,_512UL>
  xpo;
  autodiff_fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>,_512UL>
  x;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  *dos;
  undefined7 in_stack_ffffffffffdb0238;
  undefined1 in_stack_ffffffffffdb023f;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
  *in_stack_ffffffffffdb0240;
  undefined1 *puVar3;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
  *in_stack_ffffffffffdb0248;
  undefined1 *i_00;
  cpp_dec_float<100U,_int,_void> *in_stack_ffffffffffdb0250;
  data_type *this;
  data_type *this_00;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  *in_stack_ffffffffffdb0258;
  data_type *__init;
  __normal_iterator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_*,_std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>_>
  __first;
  undefined4 in_stack_ffffffffffdb0270;
  undefined4 in_stack_ffffffffffdb0274;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
  *in_stack_ffffffffffdb0280;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
  *in_stack_ffffffffffdb0288;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
  *in_stack_ffffffffffdb0298;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
  *in_stack_ffffffffffdb0368;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
  *in_stack_ffffffffffdb0370;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
  *in_stack_ffffffffffdb0380;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
  *in_stack_ffffffffffdb0388;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
  *in_stack_ffffffffffdba2e8;
  uint in_stack_ffffffffffdd84c8;
  uint in_stack_ffffffffffdd84cc;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
  *in_stack_ffffffffffdd84d0;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
  *in_stack_ffffffffffdd84d8;
  uint uVar4;
  uint uVar5;
  undefined4 uStack_3c5dc;
  undefined1 auStack_3c5d8 [123200];
  undefined4 uStack_1e498;
  undefined1 auStack_1e494 [41120];
  undefined4 uStack_143f4;
  undefined1 auStack_143f0 [41120];
  undefined4 local_a350;
  undefined1 local_a34c [41120];
  int local_2ac;
  ulong local_2a8;
  ulong local_2a0;
  undefined8 local_290;
  undefined4 *local_288;
  undefined1 *local_280;
  undefined8 local_278;
  undefined4 *local_270;
  undefined1 *local_268;
  undefined8 local_260;
  undefined4 *local_258;
  undefined1 *local_250;
  undefined8 local_248;
  undefined4 *local_240;
  undefined1 *local_238;
  undefined8 local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  undefined8 local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  undefined8 local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  undefined8 local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  undefined8 local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  undefined8 local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  undefined8 local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  undefined8 local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  undefined8 local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  undefined8 local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  undefined8 local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  undefined8 local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  undefined8 local_110;
  undefined1 *local_108;
  data_type *local_100;
  undefined8 local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined4 *local_80;
  undefined4 *local_78;
  undefined4 *local_70;
  undefined4 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined1 *local_40;
  undefined8 local_38;
  undefined8 local_30;
  data_type *local_28;
  undefined8 local_20;
  data_type *local_18;
  undefined8 local_10;
  undefined1 *local_8;
  
  __first._M_current = in_RDI._M_current;
  local_2a8 = in_RDX;
  local_2a0 = in_RSI;
  local_2ac = (int)std::setprecision(0x80);
  std::operator<<((ostream *)&std::cout,(_Setprecision)local_2ac);
  local_a350 = 0;
  local_280 = local_a34c;
  local_288 = &local_a350;
  local_290 = 0;
  local_68 = local_288;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (in_stack_ffffffffffdb0250,(longlong)in_stack_ffffffffffdb0248,in_stack_ffffffffffdb0240
            );
  boost::math::differentiation::autodiff_v1::
  make_fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
              *)CONCAT17(in_stack_ffffffffffdb023f,in_stack_ffffffffffdb0238));
  uStack_143f4 = 0xffffffff;
  local_268 = auStack_143f0;
  local_270 = &uStack_143f4;
  local_278 = 0;
  local_70 = local_270;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (in_stack_ffffffffffdb0250,(longlong)in_stack_ffffffffffdb0248,in_stack_ffffffffffdb0240
            );
  boost::math::differentiation::autodiff_v1::
  make_fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
              *)CONCAT17(in_stack_ffffffffffdb023f,in_stack_ffffffffffdb0238));
  uStack_1e498 = 1;
  local_250 = auStack_1e494;
  local_258 = &uStack_1e498;
  local_260 = 0;
  local_78 = local_258;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (in_stack_ffffffffffdb0250,(longlong)in_stack_ffffffffffdb0248,in_stack_ffffffffffdb0240
            );
  boost::math::differentiation::autodiff_v1::
  make_fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
              *)CONCAT17(in_stack_ffffffffffdb023f,in_stack_ffffffffffdb0238));
  uStack_3c5dc = 2;
  local_238 = auStack_3c5d8;
  local_240 = &uStack_3c5dc;
  local_248 = 0;
  local_80 = local_240;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (in_stack_ffffffffffdb0250,(longlong)in_stack_ffffffffffdb0248,in_stack_ffffffffffdb0240
            );
  boost::math::differentiation::autodiff_v1::detail::operator*
            ((root_type *)in_stack_ffffffffffdb0248,in_stack_ffffffffffdb0240);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>
  ::operator*(in_stack_ffffffffffdb0388,in_stack_ffffffffffdb0380);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>
  ::operator*(in_stack_ffffffffffdb0388,in_stack_ffffffffffdb0380);
  (anonymous_namespace)::
  power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>>
            (in_stack_ffffffffffdb0248,(uint)((ulong)in_stack_ffffffffffdb0240 >> 0x20));
  (anonymous_namespace)::
  power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>>
            (in_stack_ffffffffffdb0248,(uint)((ulong)in_stack_ffffffffffdb0240 >> 0x20));
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>
  ::operator*(in_stack_ffffffffffdb0388,in_stack_ffffffffffdb0380);
  (anonymous_namespace)::
  power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>>
            (in_stack_ffffffffffdb0248,(uint)((ulong)in_stack_ffffffffffdb0240 >> 0x20));
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>
  ::operator+(in_stack_ffffffffffdb0288,in_stack_ffffffffffdb0280);
  (anonymous_namespace)::
  power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>>
            (in_stack_ffffffffffdb0248,(uint)((ulong)in_stack_ffffffffffdb0240 >> 0x20));
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>
  ::operator*(in_stack_ffffffffffdb0388,in_stack_ffffffffffdb0380);
  (anonymous_namespace)::
  power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>>
            (in_stack_ffffffffffdb0248,(uint)((ulong)in_stack_ffffffffffdb0240 >> 0x20));
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>
  ::operator-(in_stack_ffffffffffdb0288,in_stack_ffffffffffdb0280);
  (anonymous_namespace)::
  power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>>
            (in_stack_ffffffffffdb0248,(uint)((ulong)in_stack_ffffffffffdb0240 >> 0x20));
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>
  ::operator*(in_stack_ffffffffffdb0388,in_stack_ffffffffffdb0380);
  (anonymous_namespace)::
  power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>>
            (in_stack_ffffffffffdb0248,(uint)((ulong)in_stack_ffffffffffdb0240 >> 0x20));
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>
  ::operator+(in_stack_ffffffffffdb0288,in_stack_ffffffffffdb0280);
  (anonymous_namespace)::
  power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>>
            (in_stack_ffffffffffdb0248,(uint)((ulong)in_stack_ffffffffffdb0240 >> 0x20));
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>
  ::operator*(in_stack_ffffffffffdb0388,in_stack_ffffffffffdb0380);
  (anonymous_namespace)::
  power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>>
            (in_stack_ffffffffffdb0248,(uint)((ulong)in_stack_ffffffffffdb0240 >> 0x20));
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>
  ::operator-(in_stack_ffffffffffdb0288,in_stack_ffffffffffdb0280);
  (anonymous_namespace)::
  zero<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>>
            (in_stack_ffffffffffdb0298);
  (anonymous_namespace)::
  zero<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>>
            (in_stack_ffffffffffdb0298);
  (anonymous_namespace)::
  zero<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>>
            (in_stack_ffffffffffdb0298);
  (anonymous_namespace)::
  zero<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>>
            (in_stack_ffffffffffdb0298);
  if ((local_2a8 & 1) == 0) {
    (anonymous_namespace)::
    one<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>>
              (in_stack_ffffffffffdba2e8);
    local_220 = &stack0xffffffffffedd2a4;
    local_228 = &stack0xffffffffffedd2a0;
    local_230 = 0;
    local_88 = local_228;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              (in_stack_ffffffffffdb0250,(longlong)in_stack_ffffffffffdb0248,
               in_stack_ffffffffffdb0240);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
    ::operator/(in_stack_ffffffffffdb0248,(root_type *)in_stack_ffffffffffdb0240);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
    ::operator=(in_stack_ffffffffffdb0240,
                (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
                 *)CONCAT17(in_stack_ffffffffffdb023f,in_stack_ffffffffffdb0238));
    (anonymous_namespace)::
    one<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>>
              (in_stack_ffffffffffdba2e8);
    local_208 = &stack0xffffffffffec91b0;
    local_210 = &stack0xffffffffffec91ac;
    local_218 = 0;
    local_90 = local_210;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              (in_stack_ffffffffffdb0250,(longlong)in_stack_ffffffffffdb0248,
               in_stack_ffffffffffdb0240);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
    ::operator/(in_stack_ffffffffffdb0248,(root_type *)in_stack_ffffffffffdb0240);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
    ::operator=(in_stack_ffffffffffdb0240,
                (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
                 *)CONCAT17(in_stack_ffffffffffdb023f,in_stack_ffffffffffdb0238));
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>
    ::operator*(in_stack_ffffffffffdb0388,in_stack_ffffffffffdb0380);
    local_1f0 = &stack0xffffffffffeb50bc;
    local_1f8 = &stack0xffffffffffeb50b8;
    local_200 = 0;
    local_98 = local_1f8;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              (in_stack_ffffffffffdb0250,(longlong)in_stack_ffffffffffdb0248,
               in_stack_ffffffffffdb0240);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
    ::operator/(in_stack_ffffffffffdb0248,(root_type *)in_stack_ffffffffffdb0240);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
    ::operator=(in_stack_ffffffffffdb0240,
                (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
                 *)CONCAT17(in_stack_ffffffffffdb023f,in_stack_ffffffffffdb0238));
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>
    ::operator*(in_stack_ffffffffffdb0388,in_stack_ffffffffffdb0380);
    local_1d8 = &stack0xffffffffffea0fc8;
    local_1e0 = &stack0xffffffffffea0fc4;
    local_1e8 = 0;
    local_a0 = local_1e0;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              (in_stack_ffffffffffdb0250,(longlong)in_stack_ffffffffffdb0248,
               in_stack_ffffffffffdb0240);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
    ::operator/(in_stack_ffffffffffdb0248,(root_type *)in_stack_ffffffffffdb0240);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
    ::operator=(in_stack_ffffffffffdb0240,
                (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
                 *)CONCAT17(in_stack_ffffffffffdb023f,in_stack_ffffffffffdb0238));
  }
  else {
    local_1c0 = &stack0xffffffffffe96f24;
    local_1c8 = &stack0xffffffffffe96f20;
    local_1d0 = 0;
    local_a8 = local_1c8;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              (in_stack_ffffffffffdb0250,(longlong)in_stack_ffffffffffdb0248,
               in_stack_ffffffffffdb0240);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
    ::operator/(in_stack_ffffffffffdb0248,(root_type *)in_stack_ffffffffffdb0240);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
    ::operator=(in_stack_ffffffffffdb0240,
                (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
                 *)CONCAT17(in_stack_ffffffffffdb023f,in_stack_ffffffffffdb0238));
    local_1a8 = &stack0xffffffffffe8ce80;
    local_1b0 = &stack0xffffffffffe8ce7c;
    local_1b8 = 0;
    local_b0 = local_1b0;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              (in_stack_ffffffffffdb0250,(longlong)in_stack_ffffffffffdb0248,
               in_stack_ffffffffffdb0240);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
    ::operator/(in_stack_ffffffffffdb0248,(root_type *)in_stack_ffffffffffdb0240);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
    ::operator=(in_stack_ffffffffffdb0240,
                (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
                 *)CONCAT17(in_stack_ffffffffffdb023f,in_stack_ffffffffffdb0238));
    local_190 = &stack0xffffffffffe82ddc;
    local_198 = &stack0xffffffffffe82dd8;
    local_1a0 = 0;
    local_b8 = local_198;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              (in_stack_ffffffffffdb0250,(longlong)in_stack_ffffffffffdb0248,
               in_stack_ffffffffffdb0240);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
    ::operator/(in_stack_ffffffffffdb0248,(root_type *)in_stack_ffffffffffdb0240);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
    ::operator=(in_stack_ffffffffffdb0240,
                (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
                 *)CONCAT17(in_stack_ffffffffffdb023f,in_stack_ffffffffffdb0238));
    local_178 = &stack0xffffffffffe78d38;
    local_180 = &stack0xffffffffffe78d34;
    local_188 = 0;
    local_c0 = local_180;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              (in_stack_ffffffffffdb0250,(longlong)in_stack_ffffffffffdb0248,
               in_stack_ffffffffffdb0240);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
    ::operator/(in_stack_ffffffffffdb0248,(root_type *)in_stack_ffffffffffdb0240);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
    ::operator=(in_stack_ffffffffffdb0240,
                (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
                 *)CONCAT17(in_stack_ffffffffffdb023f,in_stack_ffffffffffdb0238));
  }
  for (uVar5 = 1; uVar5 < local_2a8; uVar5 = uVar5 + 1) {
    (anonymous_namespace)::
    alpha<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>>
              (in_stack_ffffffffffdd84d8,in_stack_ffffffffffdd84d0,in_stack_ffffffffffdd84cc,
               in_stack_ffffffffffdd84c8);
    (anonymous_namespace)::
    zero<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>>
              (in_stack_ffffffffffdb0298);
    for (uVar4 = 0; uVar4 <= local_2a0; uVar4 = uVar4 + 2) {
      boost::math::
      binomial_coefficient<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
                ((uint)((ulong)in_stack_ffffffffffdb0248 >> 0x20),(uint)in_stack_ffffffffffdb0248);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>
      ::operator*(in_stack_ffffffffffdb0388,in_stack_ffffffffffdb0380);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>
      ::operator*(in_stack_ffffffffffdb0388,in_stack_ffffffffffdb0380);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>
      ::operator-(in_stack_ffffffffffdb0288,in_stack_ffffffffffdb0280);
      (anonymous_namespace)::
      power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>>
                (in_stack_ffffffffffdb0248,(uint)((ulong)in_stack_ffffffffffdb0240 >> 0x20));
      boost::math::differentiation::autodiff_v1::detail::operator*
                ((root_type *)in_stack_ffffffffffdb0248,in_stack_ffffffffffdb0240);
      (anonymous_namespace)::
      power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>>
                (in_stack_ffffffffffdb0248,(uint)((ulong)in_stack_ffffffffffdb0240 >> 0x20));
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>
      ::operator*(in_stack_ffffffffffdb0388,in_stack_ffffffffffdb0380);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>
      ::operator+=((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
                    *)CONCAT44(in_stack_ffffffffffdb0274,in_stack_ffffffffffdb0270),
                   (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
                    *)__first._M_current);
    }
    if ((uVar5 & 1) == 1) {
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>
      ::operator+(in_stack_ffffffffffdb0288,in_stack_ffffffffffdb0280);
      local_160 = &stack0xffffffffffe0a8cc;
      local_168 = &stack0xffffffffffe0a8c8;
      local_170 = 0;
      local_c8 = local_168;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (in_stack_ffffffffffdb0250,(longlong)in_stack_ffffffffffdb0248,
                 in_stack_ffffffffffdb0240);
      (anonymous_namespace)::
      power_n<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
                ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)in_stack_ffffffffffdb0248,(uint)((ulong)in_stack_ffffffffffdb0240 >> 0x20));
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
      ::operator/(in_stack_ffffffffffdb0248,(root_type *)in_stack_ffffffffffdb0240);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>
      ::operator*=(in_stack_ffffffffffdb0370,in_stack_ffffffffffdb0368);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>
      ::operator-(in_stack_ffffffffffdb0288,in_stack_ffffffffffdb0280);
      local_148 = &stack0xffffffffffdf6788;
      local_150 = &stack0xffffffffffdf6784;
      local_158 = 0;
      local_d0 = local_150;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (in_stack_ffffffffffdb0250,(longlong)in_stack_ffffffffffdb0248,
                 in_stack_ffffffffffdb0240);
      (anonymous_namespace)::
      power_n<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
                ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)in_stack_ffffffffffdb0248,(uint)((ulong)in_stack_ffffffffffdb0240 >> 0x20));
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
      ::operator/(in_stack_ffffffffffdb0248,(root_type *)in_stack_ffffffffffdb0240);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>
      ::operator*=(in_stack_ffffffffffdb0370,in_stack_ffffffffffdb0368);
    }
    else {
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>
      ::operator+(in_stack_ffffffffffdb0288,in_stack_ffffffffffdb0280);
      local_130 = &stack0xffffffffffde2644;
      local_138 = &stack0xffffffffffde2640;
      local_140 = 0;
      local_d8 = local_138;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (in_stack_ffffffffffdb0250,(longlong)in_stack_ffffffffffdb0248,
                 in_stack_ffffffffffdb0240);
      (anonymous_namespace)::
      power_n<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
                ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)in_stack_ffffffffffdb0248,(uint)((ulong)in_stack_ffffffffffdb0240 >> 0x20));
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
      ::operator/(in_stack_ffffffffffdb0248,(root_type *)in_stack_ffffffffffdb0240);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>
      ::operator*=(in_stack_ffffffffffdb0370,in_stack_ffffffffffdb0368);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>
      ::operator-(in_stack_ffffffffffdb0288,in_stack_ffffffffffdb0280);
      local_118 = &stack0xffffffffffdce500;
      local_120 = &stack0xffffffffffdce4fc;
      local_128 = 0;
      local_e0 = local_120;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (in_stack_ffffffffffdb0250,(longlong)in_stack_ffffffffffdb0248,
                 in_stack_ffffffffffdb0240);
      (anonymous_namespace)::
      power_n<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
                ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)in_stack_ffffffffffdb0248,(uint)((ulong)in_stack_ffffffffffdb0240 >> 0x20));
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
      ::operator/(in_stack_ffffffffffdb0248,(root_type *)in_stack_ffffffffffdb0240);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>
      ::operator*=(in_stack_ffffffffffdb0370,in_stack_ffffffffffdb0368);
    }
  }
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>
  ::operator+(in_stack_ffffffffffdb0288,in_stack_ffffffffffdb0280);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>
  ::operator+(in_stack_ffffffffffdb0288,in_stack_ffffffffffdb0280);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,512ul>
  ::operator+(in_stack_ffffffffffdb0288,in_stack_ffffffffffdb0280);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  ::vector((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
            *)0x10ca14);
  for (uVar5 = 0; (ulong)uVar5 <= local_2a0 * 2 * local_2a8; uVar5 = uVar5 + 1) {
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_512UL>
    ::at<>(in_stack_ffffffffffdb0248,(size_t)in_stack_ffffffffffdb0240);
    boost::multiprecision::operator+(in_stack_ffffffffffdb0258,(double *)in_stack_ffffffffffdb0250);
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
    ::
    number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
              ((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                *)CONCAT44(in_stack_ffffffffffdb0274,in_stack_ffffffffffdb0270),
               (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                *)__first._M_current,in_RDI._M_current);
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
    ::push_back((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                 *)in_stack_ffffffffffdb0240,
                (value_type *)CONCAT17(in_stack_ffffffffffdb023f,in_stack_ffffffffffdb0238));
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
    ::~number((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
               *)0x10cad0);
  }
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  ::begin((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
           *)CONCAT17(in_stack_ffffffffffdb023f,in_stack_ffffffffffdb0238));
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  ::end((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
         *)CONCAT17(in_stack_ffffffffffdb023f,in_stack_ffffffffffdb0238));
  this = (data_type *)&stack0xffffffffffdb02c8;
  local_108 = &stack0xffffffffffdb02c4;
  local_110 = 0;
  local_30 = 0;
  local_38 = 0;
  __init = this;
  local_100 = this;
  local_58 = local_108;
  local_28 = this;
  local_20 = local_30;
  local_18 = this;
  boost::empty_::empty_value<std::allocator<unsigned_long_long>,_0U,_true>::empty_value
            ((empty_value<std::allocator<unsigned_long_long>,_0U,_true> *)0x10cbf6);
  boost::multiprecision::backends::
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  ::data_type::data_type(this,(signed_limb_type)in_stack_ffffffffffdb0248);
  this_00 = this;
  this[1].ld.capacity = 1;
  *(byte *)((long)this + 0x14) = (byte)((ulong)local_20 >> 0x3f);
  *(undefined1 *)((long)this + 0x15) = 1;
  *(undefined1 *)((long)this + 0x16) = 0;
  std::
  accumulate<__gnu_cxx::__normal_iterator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>*,std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>>>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
            (__first,in_RDI,
             (number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
              *)&__init->ld);
  uVar5 = (uint)((ulong)in_RDI._M_current >> 0x20);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
  ::~number((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
             *)0x10cc5c);
  puVar3 = &stack0xffffffffffdb0278;
  local_f0 = &stack0xffffffffffdb0274;
  local_f8 = 0;
  local_48 = 2;
  local_50 = 0;
  i_00 = puVar3;
  local_e8 = puVar3;
  local_60 = local_f0;
  local_40 = puVar3;
  local_10 = local_48;
  local_8 = puVar3;
  boost::empty_::empty_value<std::allocator<unsigned_long_long>,_0U,_true>::empty_value
            ((empty_value<std::allocator<unsigned_long_long>,_0U,_true> *)0x10cd00);
  boost::multiprecision::backends::
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  ::data_type::data_type(this_00,(signed_limb_type)i_00);
  *(undefined4 *)(puVar3 + 0x10) = 1;
  puVar3[0x14] = (byte)((ulong)local_10 >> 0x3f);
  puVar3[0x15] = 1;
  puVar3[0x16] = 0;
  (anonymous_namespace)::
  power_n<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
            (__first._M_current,uVar5);
  bVar1 = boost::multiprecision::operator!=
                    ((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                      *)in_stack_ffffffffffdb0288,
                     (number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                      *)in_stack_ffffffffffdb0280);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
  ::~number((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
             *)0x10cd79);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
  ::~number((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
             *)0x10cd83);
  if ((bVar1 & 1) == 0) {
    bVar1 = 1;
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
    ::~number((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
               *)0x10ce5e);
    if ((bVar1 & 1) == 0) {
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
      ::~vector((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                 *)&this_00->ld);
    }
    return (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
            *)__first._M_current;
  }
  std::operator<<((ostream *)&std::cerr,"Error: result check failed\n");
  puVar2 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar2 = 0;
  __cxa_throw(puVar2,&int::typeinfo,0);
}

Assistant:

std::vector<mp::cpp_int> finite(uint_t m, uint_t n) {
  typedef mp::number<mp::cpp_dec_float<Digits10, ExponentType>> real_type;
  std::cout << std::setprecision(std::numeric_limits<real_type>::max_digits10);

  auto const x = make_fvar<real_type, Order>(0);
  auto const xpo = make_fvar<real_type, Order>(-1);
  auto const xmo = make_fvar<real_type, Order>(+1);

  auto beta = 2 * x * xpo * xmo;
  auto beta_m = power_n(beta, m);
  auto c0 = power_n(xmo, m) + power_n(x * xpo, m);
  auto s0 = power_n(xmo, m) - power_n(x * xpo, m);
  auto cn = power_n(xpo, m) + power_n(x * xmo, m);
  auto sn = power_n(xpo, m) - power_n(x * xmo, m);

  auto z1 = zero(x);
  auto z2 = zero(x);
  auto z3 = zero(x);
  auto z4 = zero(x);
  if ((n & 1) == 0) {
    z1 = one(x) / 2;
    z2 = one(x) / 2;
    z3 = c0 * cn / 2;
    z4 = s0 * sn / 2;
  } else {
    z1 = cn / 2;
    z2 = sn / 2;
    z3 = c0 / 2;
    z4 = s0 / 2;
  }
  for (unsigned k = 1; k < n; ++k) {
    auto ak = alpha(x, beta, n, k);
    auto v = zero(x);
    for (unsigned j = 0; j <= m; j += 2)
      v += binomial_coefficient<real_type>(m, j)
        * power_n(ak * ak - beta * beta, j/2) * power_n(ak, m-j);
    if ((k & 1) == 1) {
      z1 *= (v + beta_m) / power_n(real_type(2), m - 1);
      z2 *= (v - beta_m) / power_n(real_type(2), m - 1);
    } else {
      z3 *= (v + beta_m) / power_n(real_type(2), m - 1);
      z4 *= (v - beta_m) / power_n(real_type(2), m - 1);
    }
  }
  auto zmn = z1 + z2 + z3 + z4;

  std::vector<int_type> dos;
  for (unsigned i = 0; i <= 2 * m * n; ++i) dos.push_back(int_type(zmn.at(i) + 0.01));
  auto sum = std::accumulate(dos.begin(), dos.end(), int_type(0));
  if (sum != power_n(int_type(2), m * n)) {
    std::cerr << "Error: result check failed\n";
    throw(0);
  }
  return dos;
}